

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_decl.cc
# Opt level: O2

void __thiscall Decl::~Decl(Decl *this)

{
  ID *this_00;
  _Vector_base<Attr_*,_std::allocator<Attr_*>_> *this_01;
  pointer ppAVar1;
  
  this->_vptr_Decl = (_func_int **)&PTR__Decl_00140a68;
  this_00 = this->id_;
  if (this_00 != (ID *)0x0) {
    ID::~ID(this_00);
  }
  operator_delete(this_00,0x78);
  this_01 = &this->attrlist_->super__Vector_base<Attr_*,_std::allocator<Attr_*>_>;
  if (this_01 == (_Vector_base<Attr_*,_std::allocator<Attr_*>_> *)0x0) {
    this_01 = (_Vector_base<Attr_*,_std::allocator<Attr_*>_> *)0x0;
  }
  else {
    for (ppAVar1 = (((_Vector_base<Attr_*,_std::allocator<Attr_*>_> *)&this_01->_M_impl)->_M_impl).
                   super__Vector_impl_data._M_start;
        ppAVar1 != (this_01->_M_impl).super__Vector_impl_data._M_finish; ppAVar1 = ppAVar1 + 1) {
      if (*ppAVar1 != (Attr *)0x0) {
        (*((*ppAVar1)->super_DataDepElement)._vptr_DataDepElement[1])();
        this_01 = &this->attrlist_->super__Vector_base<Attr_*,_std::allocator<Attr_*>_>;
      }
    }
    std::_Vector_base<Attr_*,_std::allocator<Attr_*>_>::~_Vector_base(this_01);
  }
  operator_delete(this_01,0x18);
  this->attrlist_ = (AttrList *)0x0;
  Object::~Object(&this->super_Object);
  return;
}

Assistant:

Decl::~Decl()
	{
	delete id_;
	delete_list(AttrList, attrlist_);
	}